

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::visitEnumDecl(CheckerVisitor *this,EnumDecl *enm)

{
  SymbolInfo *pSVar1;
  ValueRef *pVVar2;
  SQChar *nameRef;
  long lVar3;
  EnumConst *c;
  EnumConst *pEVar4;
  
  if (enm->_global == true) {
    storeGlobalDeclaration(this,enm->_id,(Node *)enm);
  }
  pSVar1 = makeSymbolInfo(this,SK_ENUM);
  pVVar2 = makeValueRef(this,pSVar1);
  pVVar2->state = VRS_DECLARED;
  pVVar2->expression = (Expr *)0x0;
  (pSVar1->declarator).e = enm;
  pSVar1->ownedScope = this->currentScope;
  pSVar1->used = enm->_global;
  declareSymbol(this,enm->_id,pVVar2);
  pEVar4 = (enm->_consts)._vals;
  for (lVar3 = (ulong)(enm->_consts)._size << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    pSVar1 = makeSymbolInfo(this,SK_ENUM_CONST);
    pVVar2 = makeValueRef(this,pSVar1);
    pVVar2->state = VRS_INITIALIZED;
    pVVar2->expression = (Expr *)pEVar4->val;
    (pSVar1->declarator).ec = pEVar4;
    pSVar1->ownedScope = this->currentScope;
    pSVar1->used = enm->_global;
    nameRef = enumFqn(this->arena,enm->_id,pEVar4->id);
    declareSymbol(this,nameRef,pVVar2);
    Node::visit<SQCompilation::CheckerVisitor>((Node *)pEVar4->val,this);
    pEVar4 = pEVar4 + 1;
  }
  return;
}

Assistant:

void CheckerVisitor::visitEnumDecl(EnumDecl *enm) {

  if (enm->isGlobal()) {
    storeGlobalDeclaration(enm->name(), enm);
  }

  SymbolInfo *info = makeSymbolInfo(SK_ENUM);
  ValueRef *ev = makeValueRef(info);
  ev->state = VRS_DECLARED;
  ev->expression = nullptr;
  info->declarator.e = enm;
  info->ownedScope = currentScope;
  info->used = enm->isGlobal();
  declareSymbol(enm->name(), ev);

  for (auto &c : enm->consts()) {
    SymbolInfo *constInfo = makeSymbolInfo(SK_ENUM_CONST);
    ValueRef *cv = makeValueRef(constInfo);
    cv->state = VRS_INITIALIZED;
    cv->expression = c.val;
    constInfo->declarator.ec = &c;
    constInfo->ownedScope = currentScope;
    constInfo->used = enm->isGlobal();

    const SQChar *fqn = enumFqn(arena, enm->name(), c.id);
    declareSymbol(fqn, cv);

    c.val->visit(this);
  }
}